

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

void __thiscall
roaring::Roaring64Map::removeRangeClosed(Roaring64Map *this,uint64_t min,uint64_t max)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  long lVar4;
  iterator iVar5;
  const_iterator __last;
  _Self __tmp;
  iterator iter;
  _Rb_tree_color _Var6;
  _Rb_tree_color _Var7;
  bool bVar8;
  
  if (((min <= max) && ((this->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) &&
     (_Var7 = (_Rb_tree_color)(max >> 0x20),
     (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color <= _Var7)) {
    p_Var1 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
    lVar4 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    _Var6 = (_Rb_tree_color)(min >> 0x20);
    if (_Var6 <= *(_Rb_tree_color *)(lVar4 + 0x20)) {
      p_Var2 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      iter._M_node = &p_Var1->_M_header;
      for (p_Var3 = p_Var2; __last._M_node = &p_Var1->_M_header, p_Var3 != (_Base_ptr)0x0;
          p_Var3 = (&p_Var3->_M_left)[bVar8]) {
        bVar8 = p_Var3[1]._M_color < _Var6;
        if (!bVar8) {
          iter._M_node = p_Var3;
        }
      }
      for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar8]) {
        bVar8 = p_Var2[1]._M_color < _Var7;
        if (!bVar8) {
          __last._M_node = p_Var2;
        }
      }
      if (iter._M_node[1]._M_color == _Var6) {
        if (iter._M_node == __last._M_node) {
          roaring_bitmap_remove_range_closed
                    ((roaring_bitmap_t *)&iter._M_node[1]._M_parent,(uint32_t)min,(uint32_t)max);
          iVar5._M_node = iter._M_node;
        }
        else {
          roaring_bitmap_remove_range_closed
                    ((roaring_bitmap_t *)&iter._M_node[1]._M_parent,(uint32_t)min,0xffffffff);
          iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
        }
        eraseIfEmpty(this,iter);
        bVar8 = iter._M_node == __last._M_node;
        iter._M_node = iVar5._M_node;
        if (bVar8) {
          return;
        }
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
      ::_M_erase_aux((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                      *)this,(const_iterator)iter._M_node,__last);
      if (((_Rb_tree_header *)__last._M_node != p_Var1) && (__last._M_node[1]._M_color == _Var7)) {
        roaring_bitmap_remove_range_closed
                  ((roaring_bitmap_t *)&__last._M_node[1]._M_parent,0,(uint32_t)max);
        eraseIfEmpty(this,(iterator)__last._M_node);
        return;
      }
    }
  }
  return;
}

Assistant:

void removeRangeClosed(uint64_t min, uint64_t max) {
        if (min > max) {
            return;
        }
        uint32_t start_high = highBytes(min);
        uint32_t start_low = lowBytes(min);
        uint32_t end_high = highBytes(max);
        uint32_t end_low = lowBytes(max);

        // We put std::numeric_limits<>::max in parentheses to avoid a
        // clash with the Windows.h header under Windows.
        const uint32_t uint32_max = (std::numeric_limits<uint32_t>::max)();

        // If the outer map is empty, end_high is less than the first key,
        // or start_high is greater than the last key, then exit now because
        // there is no work to do.
        if (roarings.empty() || end_high < roarings.cbegin()->first ||
            start_high > (roarings.crbegin())->first) {
            return;
        }

        // If we get here, start_iter points to the first entry in the outer map
        // with key >= start_high. Such an entry is known to exist (i.e. the
        // iterator will not be equal to end()) because start_high <= the last
        // key in the map (thanks to the above if statement).
        auto start_iter = roarings.lower_bound(start_high);
        // end_iter points to the first entry in the outer map with
        // key >= end_high, if such a key exists. Otherwise, it equals end().
        auto end_iter = roarings.lower_bound(end_high);

        // Note that the 'lower_bound' method will find the start and end slots,
        // if they exist; otherwise it will find the next-higher slots.
        // In the case where 'start' landed on an existing slot, we need to do a
        // partial erase of that slot, and likewise for 'end'. But all the slots
        // in between can be fully erased. More precisely:
        //
        // 1. If the start point falls on an existing entry, there are two
        //    subcases:
        //    a. if the end point falls on that same entry, remove the closed
        //       interval [start_low, end_low] from that entry and we are done.
        //    b. Otherwise, remove the closed interval [start_low, uint32_max]
        //       from that entry, advance start_iter, and fall through to
        //       step 2.
        // 2. Completely erase all slots in the half-open interval
        //    [start_iter, end_iter)
        // 3. If the end point falls on an existing entry, remove the closed
        //    interval [0, end_high] from it.

        // Step 1. If the start point falls on an existing entry...
        if (start_iter->first == start_high) {
            auto &start_inner = start_iter->second;
            // 1a. if the end point falls on that same entry...
            if (start_iter == end_iter) {
                start_inner.removeRangeClosed(start_low, end_low);
                eraseIfEmpty(start_iter);
                return;
            }

            // 1b. Otherwise, remove the closed range [start_low, uint32_max]...
            start_inner.removeRangeClosed(start_low, uint32_max);
            // Advance start_iter, but keep the old value so we can check the
            // bitmap we just modified for emptiness and erase if it necessary.
            auto temp = start_iter++;
            eraseIfEmpty(temp);
        }

        // 2. Completely erase all slots in the half-open interval...
        roarings.erase(start_iter, end_iter);

        // 3. If the end point falls on an existing entry...
        if (end_iter != roarings.end() && end_iter->first == end_high) {
            auto &end_inner = end_iter->second;
            end_inner.removeRangeClosed(0, end_low);
            eraseIfEmpty(end_iter);
        }
    }